

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O0

SymOpnd * __thiscall Func::GetNextInlineeFrameArgCountSlotOpnd(Func *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined8 uVar4;
  SymOpnd *pSVar5;
  Func *this_local;
  
  if ((*(uint *)&this->field_0x240 >> 1 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.h"
                       ,0x1fd,"(!this->m_hasInlineArgsOpt)","!this->m_hasInlineArgsOpt");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((*(uint *)&this->field_0x240 >> 1 & 1) != 0) {
    uVar4 = __cxa_allocate_exception(1);
    __cxa_throw(uVar4,&Js::OperationAbortedException::typeinfo,0);
  }
  pSVar5 = GetInlineeOpndAtOffset(this,(this->actualCount + 3) * 8);
  return pSVar5;
}

Assistant:

IR::SymOpnd *GetNextInlineeFrameArgCountSlotOpnd()
    {
        Assert(!this->m_hasInlineArgsOpt);
        if (this->m_hasInlineArgsOpt)
        {
            // If the function has inlineArgsOpt turned on, jitted code will not write to stack slots for inlinee's function object
            // and arguments, until needed. If we attempt to read from those slots, we may be reading uninitialized memory.
            throw Js::OperationAbortedException();
        }
        return GetInlineeOpndAtOffset((Js::Constants::InlineeMetaArgCount + actualCount) * MachPtr);
    }